

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randname.c
# Opt level: O1

size_t randname_make(randname_type name_type,size_t min,size_t max,char *word_buf,size_t buflen,
                    char ***sections)

{
  unsigned_short *puVar1;
  ushort uVar2;
  int iVar3;
  char **ppcVar4;
  __int32_t *p_Var5;
  bool bVar6;
  randname_type rVar7;
  char cVar8;
  _Bool _Var9;
  uint32_t uVar10;
  __int32_t **pp_Var11;
  ulong uVar12;
  bool bVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  size_t sVar20;
  byte bVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  byte *pbVar25;
  char *local_58;
  
  if (1 < name_type - RANDNAME_TOLKIEN) {
    __assert_fail("name_type > 0 && name_type < RANDNAME_NUM_TYPES",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/randname.c"
                  ,0x56,
                  "size_t randname_make(randname_type, size_t, size_t, char *, size_t, const char ***)"
                 );
  }
  if (buflen <= max) {
    __assert_fail("buflen > max",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/randname.c"
                  ,0x59,
                  "size_t randname_make(randname_type, size_t, size_t, char *, size_t, const char ***)"
                 );
  }
  rVar7 = randname_make::cached_type;
  if (randname_make::cached_type != name_type) {
    ppcVar4 = sections[name_type];
    memset(randname_make::lprobs,0,0x9f78);
    pbVar25 = (byte *)*ppcVar4;
    rVar7 = name_type;
    if (pbVar25 != (byte *)0x0) {
      lVar24 = 0;
      do {
        bVar21 = *pbVar25;
        if (bVar21 == 0) {
          lVar16 = 0x1a;
          lVar22 = 0x1a;
        }
        else {
          pp_Var11 = __ctype_tolower_loc();
          p_Var5 = *pp_Var11;
          iVar23 = 0x1a;
          iVar18 = 0x1a;
          do {
            pbVar25 = pbVar25 + 1;
            iVar3 = p_Var5[bVar21];
            lVar22 = (long)iVar18;
            puVar1 = randname_make::lprobs[(long)iVar23 + -1][lVar22 + 0x17] + (long)iVar3 + 0xf;
            *puVar1 = *puVar1 + 1;
            lVar16 = (long)iVar3 + -0x61;
            puVar1 = randname_make::lprobs[iVar23][lVar22] + 0x1b;
            *puVar1 = *puVar1 + 1;
            bVar21 = *pbVar25;
            iVar23 = iVar18;
            iVar18 = (int)lVar16;
          } while (bVar21 != 0);
        }
        puVar1 = randname_make::lprobs[lVar22][lVar16] + 0x1a;
        *puVar1 = *puVar1 + 1;
        puVar1 = randname_make::lprobs[lVar22][lVar16] + 0x1b;
        *puVar1 = *puVar1 + 1;
        pbVar25 = (byte *)ppcVar4[lVar24 + 1];
        lVar24 = lVar24 + 1;
        rVar7 = name_type;
      } while (pbVar25 != (byte *)0x0);
    }
  }
  randname_make::cached_type = rVar7;
  bVar6 = false;
  do {
    if (bVar6) {
      sVar20 = 0;
    }
    else {
      uVar14 = 0x1a;
      bVar13 = false;
      iVar23 = 0;
      uVar19 = 0x1a;
      sVar20 = 0;
      local_58 = word_buf;
      do {
        if (0x1a < uVar14) {
          __assert_fail("c_cur >= 0 && c_cur <= S_WORD",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/randname.c"
                        ,0x7c,
                        "size_t randname_make(randname_type, size_t, size_t, char *, size_t, const char ***)"
                       );
        }
        uVar12 = (ulong)uVar19;
        uVar17 = (ulong)uVar14;
        uVar10 = Rand_div((uint)randname_make::lprobs[uVar12][uVar17][0x1b]);
        uVar2 = randname_make::lprobs[uVar12][uVar17][0];
        uVar15 = (uint)uVar2;
        lVar24 = 0;
        if ((int)(uint)uVar2 <= (int)uVar10) {
          lVar24 = 0;
          do {
            uVar10 = uVar10 - uVar15;
            uVar15 = (uint)*(ushort *)(uVar12 * 0x5e8 + uVar17 * 0x38 + 0x296fa2 + lVar24 * 2);
            lVar24 = lVar24 + 1;
          } while ((int)uVar15 <= (int)uVar10);
        }
        uVar15 = (uint)lVar24;
        if (0x1a < uVar15) {
          __assert_fail("c_next <= E_WORD",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/randname.c"
                        ,0x85,
                        "size_t randname_make(randname_type, size_t, size_t, char *, size_t, const char ***)"
                       );
        }
        if (uVar15 == 0x1a) {
          uVar15 = uVar14;
          if ((sVar20 < min) || (!bVar13)) {
            iVar23 = iVar23 + 1;
          }
          else {
            *local_58 = '\0';
            bVar6 = true;
          }
        }
        else {
          cVar8 = (char)lVar24 + 'a';
          *local_58 = cVar8;
          _Var9 = is_a_vowel((int)cVar8);
          if (_Var9) {
            bVar13 = true;
          }
          local_58 = local_58 + 1;
          sVar20 = sVar20 + 1;
          uVar19 = uVar14;
        }
        uVar14 = uVar15;
      } while (((iVar23 < 10) && (sVar20 <= max)) && (!bVar6));
    }
    if (bVar6) {
      return sVar20;
    }
  } while( true );
}

Assistant:

size_t randname_make(randname_type name_type, size_t min, size_t max,
					 char *word_buf, size_t buflen, const char ***sections)
{
	size_t lnum = 0;
	bool found_word = false;

	static name_probs lprobs;
	static randname_type cached_type = RANDNAME_NUM_TYPES;

	assert(name_type > 0 && name_type < RANDNAME_NUM_TYPES);

	/* To allow for a terminating character */
	assert(buflen > max);

	/* We cache one set of probabilities, only regenerate when
	   the type changes.  It's as good a way as any for now.
	   Frankly, we could probably regenerate every time. */
	if (cached_type != name_type) {
		const char **wordlist = NULL;

		wordlist = sections[name_type];

		(void)memset(lprobs, 0, sizeof(name_probs));
		build_prob(lprobs, wordlist);

		cached_type = name_type;
	}
        
	/* Generate the actual word wanted. */
	while (!found_word) {
		char *cp = word_buf;
		int c_prev = S_WORD;
		int c_cur = S_WORD;
		int tries = 0;
		bool contains_vowel = false;
		lnum = 0;

		/* We start the word again if we run out of space or have
		   had to have 10 goes to find a word that satisfies the
		   minimal conditions. */
		while (tries < 10 && lnum <= max && !found_word) {
			/* Pick the next letter based on a simple weighting
			  of which letters can follow the previous two */
			int r;
			int c_next = 0;

			assert(c_prev >= 0 && c_prev <= S_WORD);
			assert(c_cur >= 0 && c_cur <= S_WORD);

			r = randint0(lprobs[c_prev][c_cur][TOTAL]);

			while (r >= lprobs[c_prev][c_cur][c_next]) {
				r -= lprobs[c_prev][c_cur][c_next];
				c_next++;
			}

			assert(c_next <= E_WORD);
			assert(c_next >= 0);
            
			if (c_next == E_WORD) {
				/* If we've reached the end, we check if we've
				   met the simple conditions, otherwise have
				   another go at choosing a letter for this
				   position. */
				if (lnum >= min && contains_vowel) {
					*cp = '\0';
					found_word = true;
				} else {
					tries++;
				}
			} else {
				/* Add the letter to the word and move on. */
				*cp = I2A(c_next);

				if (is_a_vowel(*cp))
					contains_vowel = true;

				cp++;
				lnum++;
				assert(c_next <= S_WORD);
				assert(c_next >= 0);
				c_prev = c_cur;
				c_cur = c_next;
			}
		}
	}

	return lnum;
}